

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_mglsa_digital_filter.cc
# Opt level: O2

void __thiscall
sptk::InverseMglsaDigitalFilter::InverseMglsaDigitalFilter
          (InverseMglsaDigitalFilter *this,int num_filter_order,int num_pade_order,int num_stage,
          double alpha,bool transposition)

{
  bool bVar1;
  
  this->_vptr_InverseMglsaDigitalFilter = (_func_int **)&PTR__InverseMglsaDigitalFilter_00113ba0;
  this->num_filter_order_ = num_filter_order;
  this->num_stage_ = num_stage;
  this->alpha_ = alpha;
  this->transposition_ = transposition;
  MlsaDigitalFilter::MlsaDigitalFilter
            (&this->mlsa_digital_filter_,num_filter_order,num_pade_order,alpha,transposition);
  this->is_valid_ = true;
  if (((-1 < this->num_filter_order_) && (-1 < this->num_stage_)) &&
     (bVar1 = IsValidAlpha(this->alpha_), bVar1)) {
    if (num_stage != 0) {
      return;
    }
    if ((this->mlsa_digital_filter_).is_valid_ != false) {
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

InverseMglsaDigitalFilter::InverseMglsaDigitalFilter(int num_filter_order,
                                                     int num_pade_order,
                                                     int num_stage,
                                                     double alpha,
                                                     bool transposition)
    : num_filter_order_(num_filter_order),
      num_stage_(num_stage),
      alpha_(alpha),
      transposition_(transposition),
      mlsa_digital_filter_(num_filter_order_, num_pade_order, alpha_,
                           transposition_),
      is_valid_(true) {
  if (num_filter_order_ < 0 || num_stage_ < 0 || !sptk::IsValidAlpha(alpha_)) {
    is_valid_ = false;
    return;
  }
  if (0 == num_stage && !mlsa_digital_filter_.IsValid()) {
    is_valid_ = false;
    return;
  }
}